

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandBmc3(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Vec_Ptr_t *vCexes;
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pNtk_00;
  uint nFrames;
  char *pcVar3;
  char *pcVar4;
  uint local_f4;
  char *local_f0;
  Vec_Ptr_t *vSeqModelVec;
  Saig_ParBmc_t Pars;
  Vec_Int_t *vStatuses;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  vSeqModelVec = (Vec_Ptr_t *)0x0;
  local_f0 = (char *)0x0;
  vStatuses = (Vec_Int_t *)0x0;
  Saig_ParBmcSetDefaultParams(&Pars);
  Extra_UtilGetoptReset();
  local_f4 = 0;
LAB_0026ec89:
  iVar1 = Extra_UtilGetopt(argc,argv,"SFTHGCDJIPQRLWaxdursgvzh");
  iVar2 = globalUtilOptind;
  switch(iVar1) {
  case 0x43:
    if (argc <= globalUtilOptind) {
      pcVar3 = "Command line switch \"-C\" should be followed by an integer.\n";
      break;
    }
    iVar1 = atoi(argv[globalUtilOptind]);
    Pars.nConfLimit = iVar1;
LAB_0026ee8f:
    globalUtilOptind = iVar2 + 1;
    if (iVar1 < 0) {
switchD_0026eca9_caseD_45:
      Abc_Print(-2,"usage: bmc3 [-SFTHGCDJIPQR num] [-LW file] [-axdursgvzh]\n");
      Abc_Print(-2,"\t         performs bounded model checking with dynamic unrolling\n");
      Abc_Print(-2,"\t-S num : the starting time frame [default = %d]\n",(ulong)(uint)Pars.nStart);
      Abc_Print(-2,"\t-F num : the max number of time frames (0 = unused) [default = %d]\n",
                (ulong)(uint)Pars.nFramesMax);
      Abc_Print(-2,"\t-T num : runtime limit, in seconds [default = %d]\n",
                (ulong)(uint)Pars.nTimeOut);
      Abc_Print(-2,
                "\t-H num : runtime limit per output, in miliseconds (with \"-a\") [default = %d]\n"
                ,(ulong)(uint)Pars.nTimeOutOne);
      Abc_Print(-2,"\t-G num : runtime gap since the last CEX, in seconds [default = %d]\n",
                (ulong)(uint)Pars.nTimeOutGap);
      Abc_Print(-2,"\t-C num : max conflicts at an output [default = %d]\n",
                (ulong)(uint)Pars.nConfLimit);
      Abc_Print(-2,"\t-D num : max conflicts after jumping (0 = infinity) [default = %d]\n",
                (ulong)(uint)Pars.nConfLimitJump);
      Abc_Print(-2,"\t-J num : the number of timeframes to jump (0 = not used) [default = %d]\n",
                (ulong)(uint)Pars.nFramesJump);
      Abc_Print(-2,"\t-I num : the number of PIs to abstract [default = %d]\n",
                (ulong)(uint)Pars.nPisAbstract);
      Abc_Print(-2,
                "\t-P num : the max number of learned clauses to keep (0=unused) [default = %d]\n",
                (ulong)(uint)Pars.nLearnedStart);
      Abc_Print(-2,"\t-Q num : delta value for learned clause removal [default = %d]\n",
                (ulong)(uint)Pars.nLearnedDelta);
      Abc_Print(-2,"\t-R num : percentage to keep for learned clause removal [default = %d]\n",
                (ulong)(uint)Pars.nLearnedPerce);
      if (local_f0 == (char *)0x0) {
        local_f0 = "no logging";
      }
      Abc_Print(-2,"\t-L file: the log file name [default = %s]\n",local_f0);
      pcVar3 = Pars.pLogFileName;
      if (Pars.pLogFileName == (char *)0x0) {
        pcVar3 = "no logging";
      }
      Abc_Print(-2,"\t-W file: the log file name with per-output details [default = %s]\n",pcVar3);
      pcVar4 = "yes";
      pcVar3 = "yes";
      if (Pars.fSolveAll == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-a     : solve all outputs (do not stop when one is SAT) [default = %s]\n",
                pcVar3);
      pcVar3 = "yes";
      if (Pars.fStoreCex == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-x     : toggle storing CEXes when solving all outputs [default = %s]\n",
                pcVar3);
      pcVar3 = "yes";
      if (Pars.fDropSatOuts == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-d     : toggle dropping (replacing by 0) SAT outputs [default = %s]\n",pcVar3
               );
      pcVar3 = "not";
      if (local_f4 != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-u     : toggle performing structural OR-decomposition [default = %s]\n",
                pcVar3);
      pcVar3 = "yes";
      if (Pars.fNoRestarts == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-r     : toggle disabling periodic restarts [default = %s]\n",pcVar3);
      pcVar3 = "yes";
      if (Pars.fUseSatoko == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-s     : toggle using Satoko by Bruno Schmitt [default = %s]\n",pcVar3);
      pcVar3 = "yes";
      if (Pars.fUseGlucose == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,
                "\t-g     : toggle using Glucose 3.0 by Gilles Audemard and Laurent Simon [default = %s]\n"
                ,pcVar3);
      pcVar3 = "yes";
      if (Pars.fVerbose == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar3);
      if (Pars.fNotVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-z     : toggle suppressing report about solved outputs [default = %s]\n",
                pcVar4);
      pcVar3 = "\t-h     : print the command usage\n";
      iVar2 = -2;
LAB_0026f237:
      Abc_Print(iVar2,pcVar3);
      return 1;
    }
    goto LAB_0026ec89;
  case 0x44:
    if (globalUtilOptind < argc) {
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nConfLimitJump = iVar1;
      goto LAB_0026ee8f;
    }
    pcVar3 = "Command line switch \"-D\" should be followed by an integer.\n";
    break;
  case 0x45:
  case 0x4b:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x55:
  case 0x56:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x62:
  case 99:
  case 0x65:
  case 0x66:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x74:
  case 0x77:
  case 0x79:
    goto switchD_0026eca9_caseD_45;
  case 0x46:
    if (globalUtilOptind < argc) {
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nFramesMax = iVar1;
      goto LAB_0026ee8f;
    }
    pcVar3 = "Command line switch \"-F\" should be followed by an integer.\n";
    break;
  case 0x47:
    if (globalUtilOptind < argc) {
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nTimeOutGap = iVar1;
      goto LAB_0026ee8f;
    }
    pcVar3 = "Command line switch \"-G\" should be followed by an integer.\n";
    break;
  case 0x48:
    if (globalUtilOptind < argc) {
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nTimeOutOne = iVar1;
      goto LAB_0026ee8f;
    }
    pcVar3 = "Command line switch \"-H\" should be followed by an integer.\n";
    break;
  case 0x49:
    if (globalUtilOptind < argc) {
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nPisAbstract = iVar1;
      goto LAB_0026ee8f;
    }
    pcVar3 = "Command line switch \"-I\" should be followed by an integer.\n";
    break;
  case 0x4a:
    if (globalUtilOptind < argc) {
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nFramesJump = iVar1;
      goto LAB_0026ee8f;
    }
    pcVar3 = "Command line switch \"-J\" should be followed by an integer.\n";
    break;
  case 0x4c:
    if (globalUtilOptind < argc) {
      local_f0 = argv[globalUtilOptind];
LAB_0026ee5c:
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_0026ec89;
    }
    pcVar3 = "Command line switch \"-L\" should be followed by a file name.\n";
    break;
  case 0x50:
    if (globalUtilOptind < argc) {
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nLearnedStart = iVar1;
      goto LAB_0026ee8f;
    }
    pcVar3 = "Command line switch \"-P\" should be followed by an integer.\n";
    break;
  case 0x51:
    if (globalUtilOptind < argc) {
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nLearnedDelta = iVar1;
      goto LAB_0026ee8f;
    }
    pcVar3 = "Command line switch \"-Q\" should be followed by an integer.\n";
    break;
  case 0x52:
    if (globalUtilOptind < argc) {
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nLearnedPerce = iVar1;
      goto LAB_0026ee8f;
    }
    pcVar3 = "Command line switch \"-R\" should be followed by an integer.\n";
    break;
  case 0x53:
    if (globalUtilOptind < argc) {
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nStart = iVar1;
      goto LAB_0026ee8f;
    }
    pcVar3 = "Command line switch \"-S\" should be followed by an integer.\n";
    break;
  case 0x54:
    if (globalUtilOptind < argc) {
      iVar1 = atoi(argv[globalUtilOptind]);
      Pars.nTimeOut = iVar1;
      goto LAB_0026ee8f;
    }
    pcVar3 = "Command line switch \"-T\" should be followed by an integer.\n";
    break;
  case 0x57:
    if (globalUtilOptind < argc) {
      Pars.pLogFileName = argv[globalUtilOptind];
      goto LAB_0026ee5c;
    }
    pcVar3 = "Command line switch \"-W\" should be followed by a file name.\n";
    break;
  case 0x61:
    Pars.fSolveAll = Pars.fSolveAll ^ 1;
    goto LAB_0026ec89;
  case 100:
    Pars.fDropSatOuts = Pars.fDropSatOuts ^ 1;
    goto LAB_0026ec89;
  case 0x67:
    Pars.fUseGlucose = Pars.fUseGlucose ^ 1;
    goto LAB_0026ec89;
  case 0x72:
    Pars.fNoRestarts = Pars.fNoRestarts ^ 1;
    goto LAB_0026ec89;
  case 0x73:
    Pars.fUseSatoko = Pars.fUseSatoko ^ 1;
    goto LAB_0026ec89;
  case 0x75:
    local_f4 = local_f4 ^ 1;
    goto LAB_0026ec89;
  case 0x76:
    Pars.fVerbose = Pars.fVerbose ^ 1;
    goto LAB_0026ec89;
  case 0x78:
    Pars.fStoreCex = Pars.fStoreCex ^ 1;
    goto LAB_0026ec89;
  case 0x7a:
    Pars.fNotVerbose = Pars.fNotVerbose ^ 1;
    goto LAB_0026ec89;
  default:
    if (iVar1 == -1) {
      if (pNtk != (Abc_Ntk_t *)0x0) {
        if (pNtk->ntkType == ABC_NTK_STRASH) {
          if (pNtk->nObjCounts[8] == 0) {
            pcVar3 = "Does not work for combinational networks.\n";
            goto LAB_0026f275;
          }
          if (0 < pNtk->nConstrs) {
            pcVar3 = "Constraints have to be folded (use \"fold\").\n";
            goto LAB_0026f275;
          }
          if ((pAbc->fBatchMode != 0) && ((uint)pAbc->Status < 2)) {
            pcVar3 = "The miters is already solved; skipping the command.\n";
            iVar2 = 0;
            iVar1 = 1;
            goto LAB_0026f27c;
          }
          Pars.fUseBridge = pAbc->fBridgeMode;
          iVar2 = Abc_NtkDarBmc3(pNtk,&Pars,local_f4);
          pAbc->Status = iVar2;
          nFrames = -(uint)(pNtk->vSeqModelVec != (Vec_Ptr_t *)0x0) | Pars.iFrame;
          pAbc->nFrames = nFrames;
          if (local_f0 != (char *)0x0) {
            Abc_NtkWriteLogFile(local_f0,pAbc->pCex,iVar2,nFrames,"bmc3");
          }
          vCexes = pNtk->vSeqModelVec;
          pNtk->vSeqModelVec = (Vec_Ptr_t *)0x0;
          vSeqModelVec = vCexes;
          if ((Pars.fSolveAll == 0) || (Pars.fDropSatOuts == 0)) goto LAB_0026f3b8;
          if (vCexes == (Vec_Ptr_t *)0x0) {
            pcVar3 = "The array of counter-examples is not available.\n";
LAB_0026f3ac:
            Abc_Print(1,pcVar3);
LAB_0026f3b8:
            vStatuses = Abc_FrameDeriveStatusArray(vCexes);
            Abc_FrameReplacePoStatuses(pAbc,&vStatuses);
            if (vCexes == (Vec_Ptr_t *)0x0) {
              Abc_FrameReplaceCex(pAbc,&pNtk->pSeqModel);
            }
            else {
              Abc_FrameReplaceCexVec(pAbc,&vSeqModelVec);
            }
            return 0;
          }
          if (vCexes->nSize != pNtk->vPos->nSize) {
            pcVar3 = "The array size does not match the number of outputs.\n";
            goto LAB_0026f3ac;
          }
          Abc_NtkDropSatOutputs(pNtk,vCexes,Pars.fVerbose);
          iVar2 = 1;
          pNtk_00 = Abc_NtkDarLatchSweep(pNtk,1,1,1,0,-1,-1,0,0);
          if (pNtk_00 != (Abc_Ntk_t *)0x0) {
            Abc_FrameReplaceCurrentNetwork(pAbc,pNtk_00);
            goto LAB_0026f3b8;
          }
          pcVar3 = "Removing SAT outputs has failed.\n";
        }
        else {
          pcVar3 = "Currently only works for structurally hashed circuits.\n";
LAB_0026f275:
          iVar2 = 0;
        }
        iVar1 = -1;
LAB_0026f27c:
        Abc_Print(iVar1,pcVar3);
        return iVar2;
      }
      pcVar3 = "Empty network.\n";
      iVar2 = -1;
      goto LAB_0026f237;
    }
    goto switchD_0026eca9_caseD_45;
  }
  Abc_Print(-1,pcVar3);
  goto switchD_0026eca9_caseD_45;
}

Assistant:

int Abc_CommandBmc3( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern int Abc_NtkDarBmc3( Abc_Ntk_t * pNtk, Saig_ParBmc_t * pPars, int fOrDecomp );
    Saig_ParBmc_t Pars, * pPars = &Pars;
    Abc_Ntk_t * pNtkRes, * pNtk = Abc_FrameReadNtk(pAbc);
    Vec_Ptr_t * vSeqModelVec = NULL;
    Vec_Int_t * vStatuses = NULL;
    char * pLogFileName = NULL;
    int fOrDecomp = 0;
    int c;
    Saig_ParBmcSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "SFTHGCDJIPQRLWaxdursgvzh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nStart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nStart < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesMax < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTimeOut < 0 )
                goto usage;
            break;
        case 'H':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-H\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTimeOutOne = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTimeOutOne < 0 )
                goto usage;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTimeOutGap = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTimeOutGap < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nConfLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nConfLimit < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nConfLimitJump = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nConfLimitJump < 0 )
                goto usage;
            break;
        case 'J':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-J\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesJump = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesJump < 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nPisAbstract = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nPisAbstract < 0 )
                goto usage;
            break;
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLearnedStart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLearnedStart < 0 )
                goto usage;
            break;
        case 'Q':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-Q\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLearnedDelta = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLearnedDelta < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLearnedPerce = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLearnedPerce < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by a file name.\n" );
                goto usage;
            }
            pLogFileName = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by a file name.\n" );
                goto usage;
            }
            pPars->pLogFileName = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'a':
            pPars->fSolveAll ^= 1;
            break;
        case 'x':
            pPars->fStoreCex ^= 1;
            break;
        case 'd':
            pPars->fDropSatOuts ^= 1;
            break;
        case 'u':
            fOrDecomp ^= 1;
            break;
        case 'r':
            pPars->fNoRestarts ^= 1;
            break;
        case 's':
            pPars->fUseSatoko ^= 1;
            break;
        case 'g':
            pPars->fUseGlucose ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'z':
            pPars->fNotVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Currently only works for structurally hashed circuits.\n" );
        return 0;
    }
    if ( Abc_NtkLatchNum(pNtk) == 0 )
    {
        Abc_Print( -1, "Does not work for combinational networks.\n" );
        return 0;
    }
    if ( Abc_NtkConstrNum(pNtk) > 0 )
    {
        Abc_Print( -1, "Constraints have to be folded (use \"fold\").\n" );
        return 0;
    }
    if ( pAbc->fBatchMode && (pAbc->Status == 0 || pAbc->Status == 1) ) 
    { 
        Abc_Print( 1, "The miters is already solved; skipping the command.\n" ); 
        return 0;
    }
    pPars->fUseBridge = pAbc->fBridgeMode;
    pAbc->Status = Abc_NtkDarBmc3( pNtk, pPars, fOrDecomp );
    pAbc->nFrames = pNtk->vSeqModelVec ? -1 : pPars->iFrame;
    if ( pLogFileName )
        Abc_NtkWriteLogFile( pLogFileName, pAbc->pCex, pAbc->Status, pAbc->nFrames, "bmc3" );
    vSeqModelVec = pNtk->vSeqModelVec;  pNtk->vSeqModelVec = NULL;
    if ( pPars->fSolveAll && pPars->fDropSatOuts )
    {
        if ( vSeqModelVec == NULL )
            Abc_Print( 1,"The array of counter-examples is not available.\n" );
        else if ( Vec_PtrSize(vSeqModelVec) != Abc_NtkPoNum(pNtk) )
            Abc_Print( 1,"The array size does not match the number of outputs.\n" );
        else
        {
            extern void Abc_NtkDropSatOutputs( Abc_Ntk_t * pNtk, Vec_Ptr_t * vCexes, int fVerbose );
            Abc_NtkDropSatOutputs( pNtk, vSeqModelVec, pPars->fVerbose );
            pNtkRes = Abc_NtkDarLatchSweep( pNtk, 1, 1, 1, 0, -1, -1, 0, 0 );
            if ( pNtkRes == NULL )
            {
                Abc_Print( -1, "Removing SAT outputs has failed.\n" );
                return 1;
            }
            Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
        }
    }
    vStatuses = Abc_FrameDeriveStatusArray( vSeqModelVec );
    Abc_FrameReplacePoStatuses( pAbc, &vStatuses );
    if ( vSeqModelVec )
        Abc_FrameReplaceCexVec( pAbc, &vSeqModelVec );
    else
        Abc_FrameReplaceCex( pAbc, &pNtk->pSeqModel );
    return 0;

usage:
    Abc_Print( -2, "usage: bmc3 [-SFTHGCDJIPQR num] [-LW file] [-axdursgvzh]\n" );
    Abc_Print( -2, "\t         performs bounded model checking with dynamic unrolling\n" );
    Abc_Print( -2, "\t-S num : the starting time frame [default = %d]\n", pPars->nStart );
    Abc_Print( -2, "\t-F num : the max number of time frames (0 = unused) [default = %d]\n",      pPars->nFramesMax );
    Abc_Print( -2, "\t-T num : runtime limit, in seconds [default = %d]\n",                       pPars->nTimeOut );
    Abc_Print( -2, "\t-H num : runtime limit per output, in miliseconds (with \"-a\") [default = %d]\n",    pPars->nTimeOutOne );
    Abc_Print( -2, "\t-G num : runtime gap since the last CEX, in seconds [default = %d]\n",      pPars->nTimeOutGap );
    Abc_Print( -2, "\t-C num : max conflicts at an output [default = %d]\n",                      pPars->nConfLimit );
    Abc_Print( -2, "\t-D num : max conflicts after jumping (0 = infinity) [default = %d]\n",      pPars->nConfLimitJump );
    Abc_Print( -2, "\t-J num : the number of timeframes to jump (0 = not used) [default = %d]\n", pPars->nFramesJump );
    Abc_Print( -2, "\t-I num : the number of PIs to abstract [default = %d]\n",                   pPars->nPisAbstract );
    Abc_Print( -2, "\t-P num : the max number of learned clauses to keep (0=unused) [default = %d]\n", pPars->nLearnedStart );
    Abc_Print( -2, "\t-Q num : delta value for learned clause removal [default = %d]\n",          pPars->nLearnedDelta );
    Abc_Print( -2, "\t-R num : percentage to keep for learned clause removal [default = %d]\n",   pPars->nLearnedPerce );
    Abc_Print( -2, "\t-L file: the log file name [default = %s]\n",                               pLogFileName ? pLogFileName : "no logging" );
    Abc_Print( -2, "\t-W file: the log file name with per-output details [default = %s]\n",       pPars->pLogFileName ? pPars->pLogFileName : "no logging" );
    Abc_Print( -2, "\t-a     : solve all outputs (do not stop when one is SAT) [default = %s]\n", pPars->fSolveAll? "yes": "no" );
    Abc_Print( -2, "\t-x     : toggle storing CEXes when solving all outputs [default = %s]\n",   pPars->fStoreCex? "yes": "no" );
    Abc_Print( -2, "\t-d     : toggle dropping (replacing by 0) SAT outputs [default = %s]\n",    pPars->fDropSatOuts? "yes": "no" );
    Abc_Print( -2, "\t-u     : toggle performing structural OR-decomposition [default = %s]\n",   fOrDecomp? "yes": "not" );
    Abc_Print( -2, "\t-r     : toggle disabling periodic restarts [default = %s]\n",              pPars->fNoRestarts? "yes": "no" );
    Abc_Print( -2, "\t-s     : toggle using Satoko by Bruno Schmitt [default = %s]\n", pPars->fUseSatoko? "yes": "no" );
    Abc_Print( -2, "\t-g     : toggle using Glucose 3.0 by Gilles Audemard and Laurent Simon [default = %s]\n",pPars->fUseGlucose? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n",                           pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-z     : toggle suppressing report about solved outputs [default = %s]\n",  pPars->fNotVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}